

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O0

QMatchData * __thiscall
QUnsortedModelEngine::filter(QUnsortedModelEngine *this,QString *part,QModelIndex *parent,int n)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  QMatchData *m_00;
  QIndexMapper *in_RCX;
  QCompletionEngine *in_RDX;
  QModelIndex *in_RSI;
  QMatchData *in_RDI;
  int in_R8D;
  long in_FS_OFFSET;
  int lastIndex_1;
  int want;
  int lastRow_1;
  int lastIndex;
  int lastRow;
  bool foundInCache;
  QAbstractItemModel *model;
  QIndexMapper rest;
  QIndexMapper all;
  QIndexMapper im;
  QList<int> v;
  QMatchData m;
  QMatchData hint;
  int in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  int in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe84;
  QMatchData *this_00;
  undefined4 in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffea4;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffec8;
  QModelIndex *parent_00;
  QMatchData *str;
  QUnsortedModelEngine *in_stack_fffffffffffffef0;
  undefined1 local_f8 [40];
  undefined1 local_d0 [40];
  undefined1 local_a8 [40];
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 local_68 [40];
  int local_40;
  byte local_3c;
  undefined1 local_38 [44];
  byte local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  parent_00 = in_RSI;
  str = in_RDI;
  memset(local_38,0xaa,0x30);
  QMatchData::QMatchData
            ((QMatchData *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  local_80 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  local_70 = &DAT_aaaaaaaaaaaaaaaa;
  QList<int>::QList((QList<int> *)0xa6c47a);
  memset(local_a8,0xaa,0x28);
  QIndexMapper::QIndexMapper
            ((QIndexMapper *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             (QList<int> *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  memset(local_68,0xaa,0x30);
  QMatchData::QMatchData
            (this_00,&in_RDI->indices,in_stack_fffffffffffffe84,
             SUB41((uint)in_stack_fffffffffffffe80 >> 0x18,0));
  m_00 = (QMatchData *)QAbstractProxyModel::sourceModel();
  bVar1 = QCompletionEngine::lookupCache
                    ((QCompletionEngine *)
                     CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                     (QString *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),in_RSI
                     ,this_00);
  if (((bVar1) ||
      (bVar2 = QCompletionEngine::matchHint
                         ((QCompletionEngine *)
                          CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                          (QString *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                          in_RSI,this_00), !bVar2)) ||
     (bVar2 = QMatchData::isValid((QMatchData *)0xa6c54e), bVar2)) {
    if ((bVar1) || (bVar2 = QMatchData::isValid((QMatchData *)0xa6c583), bVar2)) {
      if (!bVar1) {
        buildIndices(in_stack_fffffffffffffef0,(QString *)str,parent_00,(int)((ulong)in_RDX >> 0x20)
                     ,in_RCX,(QMatchData *)CONCAT44(in_R8D,in_stack_fffffffffffffec8));
        local_3c = local_c & 1;
      }
      iVar3 = in_R8D;
      if (((local_3c & 1) != 0) &&
         (((in_R8D == -1 && (local_40 == -1)) ||
          (iVar4 = QIndexMapper::count((QIndexMapper *)
                                       CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80)
                                      ), iVar3 = in_R8D, iVar4 < in_R8D)))) {
        iVar4 = (**(code **)(*(long *)&m_00->indices + 0x78))(m_00,in_RCX);
        iVar4 = iVar4 + -1;
        memset(local_f8,0xaa,0x28);
        QIndexMapper::last((QIndexMapper *)
                           CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
        QIndexMapper::QIndexMapper
                  ((QIndexMapper *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                   in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78);
        iVar3 = in_R8D;
        if (in_R8D == -1) {
          in_stack_fffffffffffffe84 = -1;
        }
        else {
          in_stack_fffffffffffffe84 =
               QIndexMapper::count((QIndexMapper *)CONCAT44(in_stack_fffffffffffffe84,in_R8D));
          in_stack_fffffffffffffe84 = in_R8D - in_stack_fffffffffffffe84;
          in_stack_fffffffffffffe80 = in_R8D;
        }
        iVar5 = buildIndices(in_stack_fffffffffffffef0,(QString *)str,parent_00,
                             (int)((ulong)in_RDX >> 0x20),in_RCX,
                             (QMatchData *)CONCAT44(iVar3,in_stack_fffffffffffffec8));
        local_3c = iVar4 != iVar5;
        QIndexMapper::~QIndexMapper((QIndexMapper *)0xa6c76d);
      }
    }
    else {
      iVar3 = (**(code **)(*(long *)&m_00->indices + 0x78))(m_00,in_RCX);
      memset(local_d0,0xaa,0x28);
      QIndexMapper::QIndexMapper
                ((QIndexMapper *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                 in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78);
      iVar4 = buildIndices(in_stack_fffffffffffffef0,(QString *)str,parent_00,
                           (int)((ulong)in_RDX >> 0x20),in_RCX,
                           (QMatchData *)CONCAT44(in_R8D,in_stack_fffffffffffffec8));
      local_3c = iVar4 != iVar3 + -1;
      QIndexMapper::~QIndexMapper((QIndexMapper *)0xa6c619);
      iVar3 = in_R8D;
    }
    QString::QString((QString *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                     (QString *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    QCompletionEngine::saveInCache
              (in_RDX,(QString *)in_RCX,(QModelIndex *)CONCAT44(iVar3,in_stack_fffffffffffffec8),
               m_00);
    QString::~QString((QString *)0xa6c7a4);
    QMatchData::QMatchData
              ((QMatchData *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
               (QMatchData *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  }
  else {
    QMatchData::QMatchData
              ((QMatchData *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
  }
  QMatchData::~QMatchData((QMatchData *)0xa6c7cb);
  QIndexMapper::~QIndexMapper((QIndexMapper *)0xa6c7d8);
  QList<int>::~QList((QList<int> *)0xa6c7e5);
  QMatchData::~QMatchData((QMatchData *)0xa6c7f2);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return this_00;
}

Assistant:

QMatchData QUnsortedModelEngine::filter(const QString& part, const QModelIndex& parent, int n)
{
    QMatchData hint;

    QList<int> v;
    QIndexMapper im(v);
    QMatchData m(im, -1, true);

    const QAbstractItemModel *model = c->proxy->sourceModel();
    bool foundInCache = lookupCache(part, parent, &m);

    if (!foundInCache) {
        if (matchHint(part, parent, &hint) && !hint.isValid())
            return QMatchData();
    }

    if (!foundInCache && !hint.isValid()) {
        const int lastRow = model->rowCount(parent) - 1;
        QIndexMapper all(0, lastRow);
        int lastIndex = buildIndices(part, parent, n, all, &m);
        m.partial = (lastIndex != lastRow);
    } else {
        if (!foundInCache) { // build from hint as much as we can
            buildIndices(part, parent, INT_MAX, hint.indices, &m);
            m.partial = hint.partial;
        }
        if (m.partial && ((n == -1 && m.exactMatchIndex == -1) || (m.indices.count() < n))) {
            // need more and have more
            const int lastRow = model->rowCount(parent) - 1;
            QIndexMapper rest(hint.indices.last() + 1, lastRow);
            int want = n == -1 ? -1 : n - m.indices.count();
            int lastIndex = buildIndices(part, parent, want, rest, &m);
            m.partial = (lastRow != lastIndex);
        }
    }

    saveInCache(part, parent, m);
    return m;
}